

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O2

string * stop_bits_to_text_abi_cxx11_(string *__return_storage_ptr__,stop_bits b)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (b.value_ == two) {
    pcVar2 = "2";
    paVar1 = &local_b;
  }
  else if (b.value_ == onepointfive) {
    pcVar2 = "1.5";
    paVar1 = &local_a;
  }
  else {
    if (b.value_ != one) {
      __assert_fail("!\"can\'t be\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                    ,0x62,"std::string stop_bits_to_text(boost::asio::serial_port_base::stop_bits)")
      ;
    }
    pcVar2 = "1";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stop_bits_to_text( boost::asio::serial_port_base::stop_bits b )
{
    using type = boost::asio::serial_port_base::stop_bits::type;

    switch ( b.value() )
    {
        case type::one:
            return "1";
        case type::onepointfive:
            return "1.5";
        case type::two:
            return "2";
    }

    assert( !"can't be" );
}